

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.h
# Opt level: O0

btScalar __thiscall
btCollisionWorld::ClosestConvexResultCallback::addSingleResult
          (ClosestConvexResultCallback *this,LocalConvexResult *convexResult,bool normalInWorldSpace
          )

{
  btTransform *this_00;
  byte in_DL;
  undefined8 *in_RSI;
  long in_RDI;
  btVector3 bVar1;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(in_RSI + 6);
  *(undefined8 *)(in_RDI + 0x50) = *in_RSI;
  if ((in_DL & 1) == 0) {
    this_00 = btCollisionObject::getWorldTransform(*(btCollisionObject **)(in_RDI + 0x50));
    btTransform::getBasis(this_00);
    bVar1 = ::operator*((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                        ,(btVector3 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
    ;
    *(long *)(in_RDI + 0x30) = bVar1.m_floats._0_8_;
    *(long *)(in_RDI + 0x38) = bVar1.m_floats._8_8_;
  }
  else {
    *(undefined8 *)(in_RDI + 0x30) = in_RSI[2];
    *(undefined8 *)(in_RDI + 0x38) = in_RSI[3];
  }
  *(undefined8 *)(in_RDI + 0x40) = in_RSI[4];
  *(undefined8 *)(in_RDI + 0x48) = in_RSI[5];
  return *(btScalar *)(in_RSI + 6);
}

Assistant:

virtual	btScalar	addSingleResult(LocalConvexResult& convexResult,bool normalInWorldSpace)
		{
//caller already does the filter on the m_closestHitFraction
			btAssert(convexResult.m_hitFraction <= m_closestHitFraction);
						
			m_closestHitFraction = convexResult.m_hitFraction;
			m_hitCollisionObject = convexResult.m_hitCollisionObject;
			if (normalInWorldSpace)
			{
				m_hitNormalWorld = convexResult.m_hitNormalLocal;
			} else
			{
				///need to transform normal into worldspace
				m_hitNormalWorld = m_hitCollisionObject->getWorldTransform().getBasis()*convexResult.m_hitNormalLocal;
			}
			m_hitPointWorld = convexResult.m_hitPointLocal;
			return convexResult.m_hitFraction;
		}